

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_dns.c
# Opt level: O3

void force(N_Vector yy,sunrealtype *Q,UserData data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  void *__x;
  N_Vector_Ops p_Var6;
  SUNContext __x_00;
  void *pvVar7;
  N_Vector_Ops p_Var8;
  SUNContext pSVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = data->a;
  dVar2 = data->l0;
  dVar3 = data->params[0];
  dVar4 = data->params[1];
  dVar5 = data->F;
  __x = yy->content;
  p_Var6 = yy->ops;
  __x_00 = yy->sunctx;
  pvVar7 = yy[1].content;
  p_Var8 = yy[1].ops;
  pSVar9 = yy[1].sunctx;
  dVar10 = sin((double)__x);
  dVar11 = cos((double)__x);
  dVar12 = sin((double)__x_00);
  dVar13 = cos((double)__x_00);
  dVar18 = dVar12 * dVar11 - dVar10 * dVar13;
  dVar16 = dVar11 * dVar1 + dVar13;
  dVar17 = (dVar13 * dVar11 + dVar10 * dVar12) * dVar1 * 0.5 +
           (dVar1 * dVar1 + 1.0) * 0.25 +
           ((double)p_Var6 * (double)p_Var6 - dVar16 * (double)p_Var6);
  if (dVar17 < 0.0) {
    dVar17 = sqrt(dVar17);
  }
  else {
    dVar17 = SQRT(dVar17);
  }
  dVar15 = dVar1 * dVar18;
  dVar17 = (dVar3 * (dVar17 - dVar2) +
           dVar4 * ((((double)pSVar9 - (double)pvVar7) * dVar15 * -0.5 +
                    (dVar12 * (double)pSVar9 + dVar1 * dVar10 * (double)pvVar7) * (double)p_Var6 +
                    (((double)p_Var6 + (double)p_Var6) * (double)p_Var8 - dVar16 * (double)p_Var8))
                   / (dVar17 + dVar17))) / dVar17;
  *Q = (dVar10 * (double)p_Var6 + dVar18 * 0.5) * dVar1 * dVar17 * -0.5;
  dVar2 = ((double)p_Var6 * dVar12 + dVar15 * -0.5) * dVar17 * -0.5 + dVar12 * -dVar5;
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = dVar5 + (dVar11 * dVar1 * 0.5 + (dVar13 * 0.5 - (double)p_Var6)) * dVar17;
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])(Q + 1) = auVar14;
  return;
}

Assistant:

static void force(N_Vector yy, sunrealtype* Q, UserData data)
{
  sunrealtype a, k, c, l0, F;
  sunrealtype q, x, p;
  sunrealtype qd, xd, pd;
  sunrealtype s1, c1, s2, c2, s21, c21;
  sunrealtype l2, l, ld;
  sunrealtype f, fl;

  a  = data->a;
  k  = data->params[0];
  c  = data->params[1];
  l0 = data->l0;
  F  = data->F;

  q = NV_Ith_S(yy, 0);
  x = NV_Ith_S(yy, 1);
  p = NV_Ith_S(yy, 2);

  qd = NV_Ith_S(yy, 3);
  xd = NV_Ith_S(yy, 4);
  pd = NV_Ith_S(yy, 5);

  s1  = sin(q);
  c1  = cos(q);
  s2  = sin(p);
  c2  = cos(p);
  s21 = s2 * c1 - c2 * s1;
  c21 = c2 * c1 + s2 * s1;

  l2 = x * x - x * (c2 + a * c1) + (ONE + a * a) / FOUR + a * c21 / TWO;
  l  = sqrt(l2);
  ld = TWO * x * xd - xd * (c2 + a * c1) + x * (s2 * pd + a * s1 * qd) -
       a * s21 * (pd - qd) / TWO;
  ld /= TWO * l;

  f  = k * (l - l0) + c * ld;
  fl = f / l;

  Q[0] = -fl * a * (s21 / TWO + x * s1) / TWO;
  Q[1] = fl * (c2 / TWO - x + a * c1 / TWO) + F;
  Q[2] = -fl * (x * s2 - a * s21 / TWO) / TWO - F * s2;
}